

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O0

void TTD::SortDictIntoListOnNames<Js::RecyclableObject*>
               (BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *objToNameMap,
               List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *sortedObjList,TTAutoString *nullString)

{
  bool bVar1;
  int iVar2;
  Type *ppRVar3;
  TTAutoString *this;
  char16 *string1;
  char16 *string2;
  Type local_78;
  RecyclableObject *shiftElem;
  TTAutoString *pTStack_68;
  int32 j;
  TTAutoString *tempStr;
  RecyclableObject *temp;
  int32 i;
  int32 gap;
  uint32 gapi;
  int32 llen;
  int32 gaps [8];
  TTAutoString *nullString_local;
  List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *sortedObjList_local;
  BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *objToNameMap_local;
  
  iVar2 = JsUtil::ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>::
          Count(&sortedObjList->
                 super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>)
  ;
  if (iVar2 != 0) {
    TTDAbort_unrecoverable_error("This should be empty.");
  }
  gaps._24_8_ = sortedObjList;
  JsUtil::
  BaseDictionary<Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Map<TTD::SortDictIntoListOnNames<Js::RecyclableObject*>(JsUtil::BaseDictionary<Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>const&,JsUtil::List<Js::RecyclableObject*,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>&,TTD::UtilSupport::TTAutoString_const&)::_lambda(Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*)_1_>
            ((BaseDictionary<Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)objToNameMap,(anon_class_8_1_7e3742d8_for_fn)sortedObjList);
  _gapi = 0x12d000002bd;
  gaps[0] = 0x84;
  gaps[1] = 0x39;
  gaps[2] = 0x17;
  gaps[3] = 10;
  gaps[4] = 4;
  gaps[5] = 1;
  gap = JsUtil::ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                  (&sortedObjList->
                    super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>
                  );
  for (i = 0; (uint)i < 8; i = i + 1) {
    temp._0_4_ = (&gapi)[(uint)i];
    temp._4_4_ = (uint32)temp;
    for (; (int)(uint32)temp < gap; temp._0_4_ = (uint32)temp + 1) {
      ppRVar3 = JsUtil::
                List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(sortedObjList,(uint32)temp);
      tempStr = (TTAutoString *)*ppRVar3;
      pTStack_68 = JsUtil::
                   BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::Item(objToNameMap,(RecyclableObject **)&tempStr);
      shiftElem._4_4_ = (uint32)temp;
      while( true ) {
        bVar1 = false;
        if ((int)temp._4_4_ <= (int)shiftElem._4_4_) {
          ppRVar3 = JsUtil::
                    List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(sortedObjList,shiftElem._4_4_ - temp._4_4_);
          this = JsUtil::
                 BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::Item(objToNameMap,ppRVar3);
          string1 = UtilSupport::TTAutoString::GetStrValue(this);
          string2 = UtilSupport::TTAutoString::GetStrValue(pTStack_68);
          iVar2 = PAL_wcscmp(string1,string2);
          bVar1 = 0 < iVar2;
        }
        if (!bVar1) break;
        ppRVar3 = JsUtil::
                  List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(sortedObjList,shiftElem._4_4_ - temp._4_4_);
        local_78 = *ppRVar3;
        JsUtil::
        List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::SetItem(sortedObjList,shiftElem._4_4_,&local_78);
        shiftElem._4_4_ = shiftElem._4_4_ - temp._4_4_;
      }
      JsUtil::
      List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::SetItem(sortedObjList,shiftElem._4_4_,(RecyclableObject **)&tempStr);
    }
  }
  return;
}

Assistant:

void SortDictIntoListOnNames(const JsUtil::BaseDictionary<T, UtilSupport::TTAutoString*, HeapAllocator>& objToNameMap, JsUtil::List<T, HeapAllocator>& sortedObjList, const UtilSupport::TTAutoString& nullString)
    {
        TTDAssert(sortedObjList.Count() == 0, "This should be empty.");

        objToNameMap.Map([&](T key, UtilSupport::TTAutoString* value)
        {
            sortedObjList.Add(key);
        });

        //now sort the list so the traversal order is stable
        //Rock a custom shell sort!!!!
        const int32 gaps[8] = { 701, 301, 132, 57, 23, 10, 4, 1 };

        int32 llen = sortedObjList.Count();
        for(uint32 gapi = 0; gapi < 8; ++gapi)
        {
            int32 gap = gaps[gapi];

            for(int32 i = gap; i < llen; i++)
            {
                T temp = sortedObjList.Item(i);
                const UtilSupport::TTAutoString* tempStr = objToNameMap.Item(temp);

                int32 j = 0;
                for(j = i; j >= gap && (wcscmp(objToNameMap.Item(sortedObjList.Item(j - gap))->GetStrValue(), tempStr->GetStrValue()) > 0); j -= gap)
                {
                    T shiftElem = sortedObjList.Item(j - gap);
                    sortedObjList.SetItem(j, shiftElem);
                }

                sortedObjList.SetItem(j, temp);
            }
        }
    }